

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int mriStep_SetUserData(ARKodeMem ark_mem,void *user_data)

{
  ARKodeMem in_RSI;
  int retval;
  ARKodeMRIStepMem step_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_RSI,in_stack_ffffffffffffffe0,
                       (ARKodeMRIStepMem *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if ((local_4 == 0) &&
     ((*(long *)(in_stack_ffffffffffffffe0 + 0x160) == 0 ||
      (local_4 = arkLSSetUserData(in_RSI,in_stack_ffffffffffffffe0), local_4 == 0)))) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStep_SetUserData(ARKodeMem ark_mem, void* user_data)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set user data in ARKODELS mem */
  if (step_mem->lmem != NULL)
  {
    retval = arkLSSetUserData(ark_mem, user_data);
    if (retval != ARKLS_SUCCESS) { return (retval); }
  }

  return (ARK_SUCCESS);
}